

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O1

DoubleComplex *
gai_get_armci_memory(Integer Ichunk,Integer Jchunk,Integer Kchunk,short nbuf,Integer atype)

{
  long lVar1;
  DoubleComplex *pDVar2;
  int iVar3;
  undefined6 in_register_0000000a;
  
  iVar3 = (int)CONCAT62(in_register_0000000a,nbuf);
  lVar1 = (ulong)((long)iVar3 * 0x30) / *(ulong *)(BYTE_ARRAY_001de2f1 + atype * 0x10 + 0x2a7) +
          (long)iVar3 * 0x200000 + 0x100000;
  if ((long)((double)(Jchunk * Ichunk) +
            (double)(Kchunk * Ichunk) * (double)iVar3 + (double)(Kchunk * Jchunk) * (double)iVar3) <
      lVar1) {
    pDVar2 = (DoubleComplex *)
             ARMCI_Malloc_local(lVar1 * *(ulong *)(BYTE_ARRAY_001de2f1 + atype * 0x10 + 0x2a7));
    return pDVar2;
  }
  return (DoubleComplex *)0x0;
}

Assistant:

static DoubleComplex* 
gai_get_armci_memory(Integer Ichunk, Integer Jchunk, Integer Kchunk,
		     short int nbuf, Integer atype) {

    DoubleComplex *tmp = NULL;
    Integer elems;

    elems = (Integer) pow((double)BLOCK_SIZE,(double)2);
    elems = nbuf*elems + nbuf*elems + elems; /* A,B,C temporary buffers */
    
    /* add extra elements for safety */
    elems += nbuf*NUM_MATS*sizeof(DoubleComplex)/GAsizeofM(atype);

    /* allocate temporary storage using ARMCI_Malloc */
    if( (Integer) (((double)nbuf)*(Ichunk* Kchunk) + 
		   ((double)nbuf)*(Kchunk* Jchunk) + 
		   Ichunk* Jchunk ) < elems) {
       tmp=(DoubleComplex*)ARMCI_Malloc_local(elems*GAsizeofM(atype));
    }
    return tmp;
}